

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingCXX.cxx
# Opt level: O1

string * __thiscall
cmsys::Encoding::ToNarrow_abi_cxx11_(string *__return_storage_ptr__,Encoding *this,wchar_t *wcstr)

{
  char *pcVar1;
  pointer pcVar2;
  size_t sVar3;
  size_type __n;
  vector<char,_std::allocator<char>_> chars;
  allocator_type local_39;
  vector<char,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar3 = cmsysEncoding_wcstombs((char *)0x0,(wchar_t *)this,0);
  __n = sVar3 + 1;
  if (__n != 0) {
    std::vector<char,_std::allocator<char>_>::vector(&local_38,__n,&local_39);
    sVar3 = cmsysEncoding_wcstombs
                      (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start,(wchar_t *)this,__n);
    pcVar2 = local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (sVar3 != 0) {
      pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
      strlen(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
      std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)pcVar2);
    }
    if (local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

kwsys_stl::string Encoding::ToNarrow(const wchar_t* wcstr)
{
  kwsys_stl::string str;
  size_t length = kwsysEncoding_wcstombs(0, wcstr, 0) + 1;
  if(length > 0)
    {
    std::vector<char> chars(length);
    if(kwsysEncoding_wcstombs(&chars[0], wcstr, length) > 0)
      {
      str = &chars[0];
      }
    }
  return str;
}